

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void I210ToAR30Row_SSSE3(uint16_t *y_buf,uint16_t *u_buf,uint16_t *v_buf,uint8_t *dst_ar30,
                        YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  unkbyte10 Var11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  undefined1 auVar43 [12];
  long lVar44;
  int iVar45;
  ushort uVar46;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar64;
  ushort uVar65;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar56 [16];
  ushort uVar66;
  undefined1 auVar57 [16];
  ushort uVar68;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  undefined1 auVar69 [16];
  ushort uVar77;
  undefined1 auVar70 [16];
  ushort uVar78;
  int iVar79;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  undefined1 auVar81 [16];
  ushort uVar85;
  ushort uVar91;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar97 [16];
  int width_local;
  short sVar47;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined2 uVar58;
  short sVar63;
  short sVar67;
  undefined1 auVar80 [12];
  undefined1 auVar83 [16];
  undefined1 auVar96 [14];
  
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar5 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar19 = yuvconstants->kUVBiasB[0];
  sVar20 = yuvconstants->kUVBiasB[1];
  sVar21 = yuvconstants->kUVBiasB[2];
  sVar22 = yuvconstants->kUVBiasB[3];
  sVar23 = yuvconstants->kUVBiasB[4];
  sVar24 = yuvconstants->kUVBiasB[5];
  sVar25 = yuvconstants->kUVBiasB[6];
  sVar26 = yuvconstants->kUVBiasB[7];
  sVar27 = yuvconstants->kUVBiasG[0];
  sVar28 = yuvconstants->kUVBiasG[1];
  sVar29 = yuvconstants->kUVBiasG[2];
  sVar30 = yuvconstants->kUVBiasG[3];
  sVar31 = yuvconstants->kUVBiasG[4];
  sVar32 = yuvconstants->kUVBiasG[5];
  sVar33 = yuvconstants->kUVBiasG[6];
  sVar34 = yuvconstants->kUVBiasG[7];
  sVar35 = yuvconstants->kUVBiasR[0];
  sVar36 = yuvconstants->kUVBiasR[1];
  sVar37 = yuvconstants->kUVBiasR[2];
  sVar38 = yuvconstants->kUVBiasR[3];
  sVar39 = yuvconstants->kUVBiasR[4];
  sVar40 = yuvconstants->kUVBiasR[5];
  sVar41 = yuvconstants->kUVBiasR[6];
  sVar42 = yuvconstants->kUVBiasR[7];
  auVar6 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar44 = (long)v_buf - (long)u_buf;
  auVar18._1_14_ = in_XMM5._2_14_;
  auVar18[0] = 0xff;
  auVar95._0_10_ = CONCAT19(0xff,CONCAT18(0xff,0xff00000000000000));
  auVar95[10] = 0xff;
  auVar95[0xb] = 0xff;
  auVar96[0xc] = 0xff;
  auVar96._0_12_ = auVar95;
  auVar96[0xd] = 0xff;
  auVar97._0_2_ = (ushort)(auVar18._0_2_ << 8) >> 0xe;
  auVar97._2_2_ = 3;
  auVar97._4_2_ = 3;
  auVar97._6_2_ = 3;
  auVar97._8_2_ = (ushort)((unkuint10)auVar95._0_10_ >> 0x4e);
  auVar97._10_2_ = auVar95._10_2_ >> 0xe;
  auVar97._12_2_ = auVar96._12_2_ >> 0xe;
  auVar97._14_2_ = 3;
  auVar97 = psllw(auVar97,4);
  do {
    uVar1 = *(ulong *)u_buf;
    uVar2 = *(undefined8 *)((long)u_buf + lVar44);
    u_buf = (uint16_t *)((long)u_buf + 8);
    auVar49._8_4_ = 0;
    auVar49._0_8_ = uVar1;
    auVar49._12_2_ = (short)(uVar1 >> 0x30);
    auVar49._14_2_ = (short)((ulong)uVar2 >> 0x30);
    auVar48._12_4_ = auVar49._12_4_;
    auVar48._8_2_ = 0;
    auVar48._0_8_ = uVar1;
    auVar48._10_2_ = (short)((ulong)uVar2 >> 0x20);
    auVar94._10_6_ = auVar48._10_6_;
    auVar94._8_2_ = (short)(uVar1 >> 0x20);
    auVar94._0_8_ = uVar1;
    auVar93._8_8_ = auVar94._8_8_;
    auVar93._6_2_ = (short)((ulong)uVar2 >> 0x10);
    auVar93._4_2_ = (short)(uVar1 >> 0x10);
    auVar93._0_2_ = (undefined2)uVar1;
    auVar93._2_2_ = (short)uVar2;
    auVar49 = psraw(auVar93,2);
    sVar47 = auVar49._0_2_;
    sVar63 = auVar49._2_2_;
    auVar50._0_2_ =
         CONCAT11((0 < sVar63) * (sVar63 < 0x100) * auVar49[2] - (0xff < sVar63),
                  (0 < sVar47) * (sVar47 < 0x100) * auVar49[0] - (0xff < sVar47));
    sVar67 = auVar49._4_2_;
    sVar8 = auVar49._6_2_;
    auVar51._0_4_ =
         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar49[6] - (0xff < sVar8),
                  CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar49[4] - (0xff < sVar67),
                           auVar50._0_2_));
    sVar9 = auVar49._8_2_;
    sVar10 = auVar49._10_2_;
    auVar52._0_6_ =
         CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar49[10] - (0xff < sVar10),
                  CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar49[8] - (0xff < sVar9),auVar51._0_4_
                          ));
    sVar9 = auVar49._12_2_;
    sVar10 = auVar49._14_2_;
    auVar53._0_8_ =
         CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar49[0xe] - (0xff < sVar10),
                  CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar49[0xc] - (0xff < sVar9),
                           auVar52._0_6_));
    auVar54._0_10_ =
         CONCAT19((0 < sVar63) * (sVar63 < 0x100) * auVar49[2] - (0xff < sVar63),
                  CONCAT18((0 < sVar47) * (sVar47 < 0x100) * auVar49[0] - (0xff < sVar47),
                           auVar53._0_8_));
    auVar55[10] = (0 < sVar67) * (sVar67 < 0x100) * auVar49[4] - (0xff < sVar67);
    auVar55._0_10_ = auVar54._0_10_;
    auVar55[0xb] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[6] - (0xff < sVar8);
    uVar58 = (undefined2)((ulong)auVar53._0_8_ >> 0x30);
    auVar55._12_2_ = uVar58;
    auVar55._14_2_ = uVar58;
    uVar58 = (undefined2)((uint6)auVar52._0_6_ >> 0x20);
    auVar54._12_4_ = auVar55._12_4_;
    auVar54._10_2_ = uVar58;
    auVar53._10_6_ = auVar54._10_6_;
    auVar53._8_2_ = uVar58;
    uVar58 = (undefined2)((uint)auVar51._0_4_ >> 0x10);
    auVar52._8_8_ = auVar53._8_8_;
    auVar52._6_2_ = uVar58;
    auVar51._6_10_ = auVar52._6_10_;
    auVar51._4_2_ = uVar58;
    auVar50._4_12_ = auVar51._4_12_;
    auVar50._2_2_ = auVar50._0_2_;
    auVar93 = psllw(*(undefined1 (*) [16])y_buf,6);
    y_buf = (uint16_t *)((long)y_buf + 0x10);
    auVar49 = pmaddubsw(auVar50,auVar3);
    auVar56._0_2_ = sVar19 - auVar49._0_2_;
    auVar56._2_2_ = sVar20 - auVar49._2_2_;
    auVar56._4_2_ = sVar21 - auVar49._4_2_;
    auVar56._6_2_ = sVar22 - auVar49._6_2_;
    auVar56._8_2_ = sVar23 - auVar49._8_2_;
    auVar56._10_2_ = sVar24 - auVar49._10_2_;
    auVar56._12_2_ = sVar25 - auVar49._12_2_;
    auVar56._14_2_ = sVar26 - auVar49._14_2_;
    auVar49 = pmaddubsw(auVar50,auVar4);
    auVar69._0_2_ = sVar27 - auVar49._0_2_;
    auVar69._2_2_ = sVar28 - auVar49._2_2_;
    auVar69._4_2_ = sVar29 - auVar49._4_2_;
    auVar69._6_2_ = sVar30 - auVar49._6_2_;
    auVar69._8_2_ = sVar31 - auVar49._8_2_;
    auVar69._10_2_ = sVar32 - auVar49._10_2_;
    auVar69._12_2_ = sVar33 - auVar49._12_2_;
    auVar69._14_2_ = sVar34 - auVar49._14_2_;
    auVar49 = pmaddubsw(auVar50,auVar5);
    auVar81._0_2_ = sVar35 - auVar49._0_2_;
    auVar81._2_2_ = sVar36 - auVar49._2_2_;
    auVar81._4_2_ = sVar37 - auVar49._4_2_;
    auVar81._6_2_ = sVar38 - auVar49._6_2_;
    auVar81._8_2_ = sVar39 - auVar49._8_2_;
    auVar81._10_2_ = sVar40 - auVar49._10_2_;
    auVar81._12_2_ = sVar41 - auVar49._12_2_;
    auVar81._14_2_ = sVar42 - auVar49._14_2_;
    auVar94 = pmulhuw(auVar93,auVar6);
    auVar49 = paddsw(auVar56,auVar94);
    auVar93 = paddsw(auVar69,auVar94);
    auVar94 = paddsw(auVar81,auVar94);
    auVar49 = psraw(auVar49,4);
    auVar93 = psraw(auVar93,4);
    auVar94 = psraw(auVar94,4);
    Var11 = CONCAT19(3,CONCAT18(0xff,0x3ff03ff03ff03ff));
    auVar12[10] = 0xff;
    auVar12._0_10_ = Var11;
    auVar12[0xb] = 3;
    auVar13[0xc] = 0xff;
    auVar13._0_12_ = auVar12;
    auVar13[0xd] = 3;
    sVar47 = auVar49._0_2_;
    uVar46 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar49._2_2_;
    uVar59 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar49._4_2_;
    uVar60 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar49._6_2_;
    uVar61 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = (short)((unkuint10)Var11 >> 0x40);
    sVar63 = auVar49._8_2_;
    uVar62 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    sVar47 = auVar12._10_2_;
    sVar63 = auVar49._10_2_;
    uVar64 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    sVar47 = auVar13._12_2_;
    sVar63 = auVar49._12_2_;
    sVar67 = auVar49._14_2_;
    uVar65 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    uVar66 = (ushort)(0x3ff < sVar67) * 0x3ff | (ushort)(0x3ff >= sVar67) * sVar67;
    Var11 = CONCAT19(3,CONCAT18(0xff,0x3ff03ff03ff03ff));
    auVar14[10] = 0xff;
    auVar14._0_10_ = Var11;
    auVar14[0xb] = 3;
    auVar15[0xc] = 0xff;
    auVar15._0_12_ = auVar14;
    auVar15[0xd] = 3;
    sVar47 = auVar93._0_2_;
    uVar68 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar93._2_2_;
    uVar71 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar93._4_2_;
    uVar72 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar93._6_2_;
    uVar73 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = (short)((unkuint10)Var11 >> 0x40);
    sVar63 = auVar93._8_2_;
    uVar74 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    sVar47 = auVar14._10_2_;
    sVar63 = auVar93._10_2_;
    uVar75 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    sVar47 = auVar15._12_2_;
    sVar63 = auVar93._12_2_;
    sVar67 = auVar93._14_2_;
    uVar76 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    uVar77 = (ushort)(0x3ff < sVar67) * 0x3ff | (ushort)(0x3ff >= sVar67) * sVar67;
    Var11 = CONCAT19(3,CONCAT18(0xff,0x3ff03ff03ff03ff));
    auVar16[10] = 0xff;
    auVar16._0_10_ = Var11;
    auVar16[0xb] = 3;
    auVar17[0xc] = 0xff;
    auVar17._0_12_ = auVar16;
    auVar17[0xd] = 3;
    sVar47 = auVar94._0_2_;
    uVar78 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar94._2_2_;
    uVar85 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar94._4_2_;
    uVar86 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar94._6_2_;
    uVar87 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = (short)((unkuint10)Var11 >> 0x40);
    sVar63 = auVar94._8_2_;
    uVar88 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    sVar47 = auVar16._10_2_;
    sVar63 = auVar94._10_2_;
    uVar89 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    sVar47 = auVar17._12_2_;
    sVar63 = auVar94._12_2_;
    sVar67 = auVar94._14_2_;
    uVar90 = (ushort)(sVar47 < sVar63) * sVar47 | (ushort)(sVar47 >= sVar63) * sVar63;
    uVar91 = (ushort)(0x3ff < sVar67) * 0x3ff | (ushort)(0x3ff >= sVar67) * sVar67;
    sVar47 = (-1 < (short)uVar61) * uVar61;
    sVar63 = (-1 < (short)uVar73) * uVar73;
    auVar82._2_2_ = (-1 < (short)uVar85) * uVar85;
    auVar82._0_2_ = (-1 < (short)uVar78) * uVar78;
    auVar82._4_2_ = (-1 < (short)uVar86) * uVar86;
    auVar82._6_2_ = (-1 < (short)uVar87) * uVar87;
    auVar82._8_2_ = (-1 < (short)uVar88) * uVar88;
    auVar82._10_2_ = (-1 < (short)uVar89) * uVar89;
    auVar82._12_2_ = (-1 < (short)uVar90) * uVar90;
    auVar82._14_2_ = (-1 < (short)uVar91) * uVar91;
    auVar49 = psllw(auVar82,4);
    auVar57._8_8_ =
         (undefined8)
         (CONCAT64(CONCAT42(CONCAT22(auVar49._6_2_,sVar47),auVar49._4_2_),
                   CONCAT22((-1 < (short)uVar60) * uVar60,sVar47)) >> 0x10);
    auVar57._6_2_ = auVar49._2_2_;
    auVar57._4_2_ = (-1 < (short)uVar59) * uVar59;
    auVar57._2_2_ = auVar49._0_2_;
    auVar57._0_2_ = (-1 < (short)uVar46) * uVar46;
    auVar92._2_2_ = auVar49._8_2_;
    auVar92._0_2_ = (-1 < (short)uVar62) * uVar62;
    auVar92._4_2_ = (-1 < (short)uVar64) * uVar64;
    auVar92._6_2_ = auVar49._10_2_;
    auVar92._8_2_ = (-1 < (short)uVar65) * uVar65;
    auVar92._10_2_ = auVar49._12_2_;
    auVar92._12_2_ = (-1 < (short)uVar66) * uVar66;
    auVar92._14_2_ = auVar49._14_2_;
    iVar45 = CONCAT22(auVar97._6_2_,sVar63);
    Var11 = CONCAT64(CONCAT42(iVar45,auVar97._4_2_),CONCAT22((-1 < (short)uVar72) * uVar72,sVar63));
    auVar43._4_8_ = (long)((unkuint10)Var11 >> 0x10);
    auVar43._2_2_ = auVar97._2_2_;
    auVar43._0_2_ = (-1 < (short)uVar71) * uVar71;
    iVar79 = CONCAT22(auVar97._8_2_,(-1 < (short)uVar74) * uVar74);
    auVar80._0_8_ = CONCAT26(auVar97._10_2_,CONCAT24((-1 < (short)uVar75) * uVar75,iVar79));
    auVar80._8_2_ = (-1 < (short)uVar76) * uVar76;
    auVar80._10_2_ = auVar97._12_2_;
    auVar83._12_2_ = (-1 < (short)uVar77) * uVar77;
    auVar83._0_12_ = auVar80;
    auVar83._14_2_ = auVar97._14_2_;
    auVar70._0_4_ = CONCAT22(auVar97._0_2_,(-1 < (short)uVar68) * uVar68) << 10;
    auVar70._4_4_ = auVar43._0_4_ << 10;
    auVar70._8_4_ = (int)((unkuint10)Var11 >> 0x10) << 10;
    auVar70._12_4_ = iVar45 << 10;
    auVar84._0_4_ = iVar79 << 10;
    auVar84._4_4_ = (int)((ulong)auVar80._0_8_ >> 0x20) << 10;
    auVar84._8_4_ = auVar80._8_4_ << 10;
    auVar84._12_4_ = auVar83._12_4_ << 10;
    *(undefined1 (*) [16])dst_ar30 = auVar57 | auVar70;
    *(undefined1 (*) [16])((long)dst_ar30 + 0x10) = auVar92 | auVar84;
    dst_ar30 = (uint8_t *)((long)dst_ar30 + 0x20);
    iVar45 = width + -8;
    bVar7 = 7 < width;
    width = iVar45;
  } while (iVar45 != 0 && bVar7);
  return;
}

Assistant:

void OMITFP I210ToAR30Row_SSSE3(const uint16_t* y_buf,
                                const uint16_t* u_buf,
                                const uint16_t* v_buf,
                                uint8_t* dst_ar30,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrlw       $14,%%xmm5                    \n"
      "psllw       $4,%%xmm5                     \n"  // 2 alpha bits
      "pxor        %%xmm6,%%xmm6                 \n"
      "pcmpeqb     %%xmm7,%%xmm7                 \n"  // 0 for min
      "psrlw       $6,%%xmm7                     \n"  // 1023 for max

    LABELALIGN
      "1:                                        \n"
    READYUV210
    YUVTORGB16(yuvconstants)
    STOREAR30
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_ar30]"+r"(dst_ar30),  // %[dst_ar30]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6", "xmm7"
  );
}